

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxDetector.cpp
# Opt level: O2

void cullPoints2(int n,cbtScalar *p,int m,int i0,int *iret)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 in_ZMM8 [64];
  float local_98;
  float local_88;
  int avail [8];
  cbtScalar A [8];
  
  iVar8 = 1;
  if (n == 1) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)p;
  }
  else if (n == 2) {
    auVar14._0_4_ = (float)*(undefined8 *)p + (float)*(undefined8 *)(p + 2);
    auVar14._4_4_ =
         (float)((ulong)*(undefined8 *)p >> 0x20) + (float)((ulong)*(undefined8 *)(p + 2) >> 0x20);
    auVar14._8_8_ = 0;
    auVar5._8_4_ = 0x3f000000;
    auVar5._0_8_ = 0x3f0000003f000000;
    auVar5._12_4_ = 0x3f000000;
    auVar10 = vmulps_avx512vl(auVar14,auVar5);
  }
  else {
    iVar6 = 1;
    if (1 < n) {
      iVar6 = n;
    }
    auVar10 = ZEXT816(0) << 0x40;
    fVar13 = 0.0;
    uVar7 = 0;
    while (iVar6 - 1 != uVar7) {
      uVar9 = *(ulong *)(p + uVar7 * 2);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar9;
      uVar1 = *(ulong *)(p + uVar7 * 2 + 2);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar1;
      uVar7 = uVar7 + 1;
      auVar11 = vmovshdup_avx(auVar15);
      auVar17 = vmovshdup_avx(auVar19);
      auVar11 = vfmsub213ss_fma(auVar17,auVar15,ZEXT416((uint)(auVar11._0_4_ * (float)uVar1)));
      auVar16._0_4_ = (float)uVar1 + (float)uVar9;
      auVar16._4_4_ = (float)(uVar1 >> 0x20) + (float)(uVar9 >> 0x20);
      auVar16._8_8_ = 0;
      fVar23 = auVar11._0_4_;
      auVar20._4_4_ = fVar23;
      auVar20._0_4_ = fVar23;
      auVar20._8_4_ = fVar23;
      auVar20._12_4_ = fVar23;
      fVar13 = fVar13 + fVar23;
      auVar10 = vfmadd231ps_fma(auVar10,auVar16,auVar20);
    }
    uVar7 = *(ulong *)p;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar7;
    uVar9 = *(ulong *)(p + (long)(n * 2) + -2);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar9;
    auVar11 = vmovshdup_avx(auVar17);
    auVar17 = vmovshdup_avx(auVar21);
    auVar11 = vfmsub213ss_fma(auVar11,auVar21,ZEXT416((uint)(auVar17._0_4_ * (float)uVar7)));
    auVar22._0_4_ = (float)uVar7 + (float)uVar9;
    auVar22._4_4_ = (float)(uVar7 >> 0x20) + (float)(uVar9 >> 0x20);
    auVar22._8_8_ = 0;
    fVar23 = auVar11._0_4_;
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar11 = vandps_avx512vl(ZEXT416((uint)(fVar13 + fVar23)),auVar11);
    auVar18._4_4_ = fVar23;
    auVar18._0_4_ = fVar23;
    auVar18._8_4_ = fVar23;
    auVar18._12_4_ = fVar23;
    uVar2 = vcmpss_avx512f(auVar11,ZEXT416(0x34000000),0xe);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar11 = vfmadd213ps_fma(auVar18,auVar22,auVar10);
    fVar13 = (float)((uint)bVar3 * (int)(1.0 / ((fVar13 + fVar23) * 3.0)) +
                    (uint)!bVar3 * 0x5d5e0b6b);
    auVar10._0_4_ = auVar11._0_4_ * fVar13;
    auVar10._4_4_ = auVar11._4_4_ * fVar13;
    auVar10._8_4_ = auVar11._8_4_ * fVar13;
    auVar10._12_4_ = auVar11._12_4_ * fVar13;
  }
  auVar11 = vmovshdup_avx(auVar10);
  uVar9 = (ulong)(uint)(~(n >> 0x1f) & n);
  for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    local_98 = auVar11._0_4_;
    local_88 = auVar10._0_4_;
    fVar13 = atan2f(p[uVar7 * 2 + 1] - local_98,p[uVar7 * 2] - local_88);
    A[uVar7] = fVar13;
  }
  for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    avail[uVar7] = 1;
  }
  auVar24._8_4_ = 0x7fffffff;
  auVar24._0_8_ = 0x7fffffff7fffffff;
  auVar24._12_4_ = 0x7fffffff;
  avail[i0] = 0;
  *iret = i0;
  for (; iVar8 < m; iVar8 = iVar8 + 1) {
    auVar25._0_4_ = (float)iVar8;
    auVar25._4_12_ = in_ZMM8._4_12_;
    auVar10 = vfmadd213ss_fma(auVar25,ZEXT416((uint)(6.2831855 / (float)m)),ZEXT416((uint)A[i0]));
    iret = iret + 1;
    uVar7 = 0;
    *iret = i0;
    uVar2 = vcmpss_avx512f(auVar10,SUB6416(ZEXT464(0x40490fdb),0),0xe);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar26 = ZEXT1664(SUB6416(ZEXT464(0x4e6e6b28),0));
    iVar6 = i0;
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      if (avail[uVar7] != 0) {
        auVar11 = vandps_avx(ZEXT416((uint)(A[uVar7] -
                                           (float)((uint)bVar3 * (int)(auVar10._0_4_ + -6.2831855) +
                                                  (uint)!bVar3 * (int)auVar10._0_4_))),auVar24);
        uVar2 = vcmpss_avx512f(auVar11,SUB6416(ZEXT464(0x40490fdb),0),0xe);
        bVar4 = (bool)((byte)uVar2 & 1);
        auVar12._4_12_ = auVar11._4_12_;
        auVar12._0_4_ =
             (float)((uint)bVar4 * (int)(6.2831855 - auVar11._0_4_) +
                    (uint)!bVar4 * (int)auVar11._0_4_);
        in_ZMM8 = ZEXT1664(auVar12);
        if (auVar12._0_4_ < auVar26._0_4_) {
          iVar6 = (int)uVar7;
          *iret = iVar6;
          auVar26 = ZEXT1664(auVar12);
        }
      }
    }
    avail[iVar6] = 0;
  }
  return;
}

Assistant:

void cullPoints2(int n, cbtScalar p[], int m, int i0, int iret[])
{
	// compute the centroid of the polygon in cx,cy
	int i, j;
	cbtScalar a, cx, cy, q;
	if (n == 1)
	{
		cx = p[0];
		cy = p[1];
	}
	else if (n == 2)
	{
		cx = cbtScalar(0.5) * (p[0] + p[2]);
		cy = cbtScalar(0.5) * (p[1] + p[3]);
	}
	else
	{
		a = 0;
		cx = 0;
		cy = 0;
		for (i = 0; i < (n - 1); i++)
		{
			q = p[i * 2] * p[i * 2 + 3] - p[i * 2 + 2] * p[i * 2 + 1];
			a += q;
			cx += q * (p[i * 2] + p[i * 2 + 2]);
			cy += q * (p[i * 2 + 1] + p[i * 2 + 3]);
		}
		q = p[n * 2 - 2] * p[1] - p[0] * p[n * 2 - 1];
		if (cbtFabs(a + q) > SIMD_EPSILON)
		{
			a = 1.f / (cbtScalar(3.0) * (a + q));
		}
		else
		{
			a = BT_LARGE_FLOAT;
		}
		cx = a * (cx + q * (p[n * 2 - 2] + p[0]));
		cy = a * (cy + q * (p[n * 2 - 1] + p[1]));
	}

	// compute the angle of each point w.r.t. the centroid
	cbtScalar A[8];
	for (i = 0; i < n; i++) A[i] = cbtAtan2(p[i * 2 + 1] - cy, p[i * 2] - cx);

	// search for points that have angles closest to A[i0] + i*(2*pi/m).
	int avail[8];
	for (i = 0; i < n; i++) avail[i] = 1;
	avail[i0] = 0;
	iret[0] = i0;
	iret++;
	for (j = 1; j < m; j++)
	{
		a = cbtScalar(j) * (2 * M__PI / m) + A[i0];
		if (a > M__PI) a -= 2 * M__PI;
		cbtScalar maxdiff = 1e9, diff;

		*iret = i0;  // iret is not allowed to keep this value, but it sometimes does, when diff=#QNAN0

		for (i = 0; i < n; i++)
		{
			if (avail[i])
			{
				diff = cbtFabs(A[i] - a);
				if (diff > M__PI) diff = 2 * M__PI - diff;
				if (diff < maxdiff)
				{
					maxdiff = diff;
					*iret = i;
				}
			}
		}
#if defined(DEBUG) || defined(_DEBUG)
		cbtAssert(*iret != i0);  // ensure iret got set
#endif
		avail[*iret] = 0;
		iret++;
	}
}